

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

void __thiscall fizplex::Base::~Base(Base *this)

{
  unsigned_long *puVar1;
  
  puVar1 = (this->row_ordering)._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  if (puVar1 != (unsigned_long *)0x0) {
    operator_delete__(puVar1);
  }
  (this->row_ordering)._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = (unsigned_long *)0x0;
  operator_delete((this->work).vals._M_data);
  std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::~vector(&this->etms);
  return;
}

Assistant:

Base() = delete;